

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_keyword_stmt * tro_read_module_name(trt_keyword_stmt *__return_storage_ptr__,trt_tree_ctx *tc)

{
  void *pvVar1;
  char *pcVar2;
  bool bVar3;
  lys_module *local_38;
  lys_module *local_30;
  trt_tree_ctx *tc_local;
  
  if (tc != (trt_tree_ctx *)0x0) {
    bVar3 = false;
    if (tc->lysc_tree == '\0') {
      bVar3 = ((byte)tc->pmod->field_0x79 >> 1 & 1) != 0;
    }
    pcVar2 = "module";
    if (bVar3) {
      pcVar2 = "submodule";
    }
    __return_storage_ptr__->section_name = pcVar2;
    if (tc->lysc_tree == '\0') {
      if (((byte)tc->pmod->field_0x79 >> 1 & 1) == 0) {
        local_30 = (lys_module *)tc->pmod->mod->name;
      }
      else {
        local_30 = tc->pmod[1].mod;
      }
      local_38 = local_30;
    }
    else {
      local_38 = (lys_module *)tc->cmod->mod->name;
    }
    __return_storage_ptr__->argument = (char *)local_38;
    pvVar1 = tro_tree_ctx_get_node(tc);
    __return_storage_ptr__->has_node = pvVar1 != (void *)0x0;
    return __return_storage_ptr__;
  }
  __assert_fail("tc",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xa1f,"struct trt_keyword_stmt tro_read_module_name(const struct trt_tree_ctx *)");
}

Assistant:

static struct trt_keyword_stmt
tro_read_module_name(const struct trt_tree_ctx *tc)
{
    assert(tc);
    struct trt_keyword_stmt ret;

    ret.section_name = !tc->lysc_tree && tc->pmod->is_submod ?
            TRD_KEYWORD_SUBMODULE :
            TRD_KEYWORD_MODULE;

    ret.argument = !tc->lysc_tree ?
            LYSP_MODULE_NAME(tc->pmod) :
            tc->cmod->mod->name;

    ret.has_node = tro_tree_ctx_get_node(tc) ? 1 : 0;

    return ret;
}